

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O3

void __thiscall TestSuite::readyTest(TestSuite *this,string *test_name)

{
  string *psVar1;
  rep rVar2;
  
  printf("[ .... ] %s\n",(test_name->_M_dataplus)._M_p);
  if ((((this->options).printTestMessage != false) || (this->displayMsg == true)) &&
     (this->suppressMsg == false)) {
    printf("\x1b[1;30m   === TEST MESSAGE (BEGIN) ===\n\x1b[0m");
  }
  fflush(_stdout);
  psVar1 = getTestName_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)psVar1);
  rVar2 = std::chrono::_V2::system_clock::now();
  (this->startTimeLocal).__d.__r = rVar2;
  return;
}

Assistant:

void readyTest(const std::string& test_name) {
        printf("[ " "...." " ] %s\n", test_name.c_str());
        if ( (options.printTestMessage || displayMsg) &&
             !suppressMsg ) {
            printf(_CL_D_GRAY("   === TEST MESSAGE (BEGIN) ===\n"));
        }
        fflush(stdout);

        getTestName() = test_name;
        startTimeLocal = std::chrono::system_clock::now();
    }